

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  short sVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  undefined1 uVar9;
  uint uVar10;
  ImGuiViewportP *pIVar11;
  byte bVar12;
  float fVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow *pIVar24;
  ImGuiWindow *pIVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  float fVar28;
  
  pIVar7 = GImGui;
  pIVar8 = GImGui->MovingWindow;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    pIVar11 = (ImGuiViewportP *)0x0;
    pIVar24 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar11 = pIVar8->Viewport;
    pIVar8->Viewport = GImGui->MouseViewport;
    pIVar24 = (ImGuiWindow *)0x0;
    if ((pIVar8->Flags & 0x200) == 0) {
      pIVar24 = pIVar8;
    }
  }
  IVar4 = (pIVar7->Style).TouchExtraPadding;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = IVar4.x;
  auVar27._4_4_ = IVar4.y;
  if ((pIVar7->IO).ConfigWindowsResizeFromEdges == true) {
    auVar27 = maxps(auVar27,_DAT_0019ca00);
    lVar14 = auVar27._0_8_;
  }
  else {
    lVar14 = ((ulong)(uint)IVar4.y << 0x20) + ((ulong)IVar4 & 0xffffffff);
  }
  lVar15 = (long)(pIVar7->Windows).Size;
  if (lVar15 < 1) {
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    uVar16 = lVar15 + 1;
    pIVar22 = (ImGuiWindow *)0x0;
    do {
      pIVar23 = (pIVar7->Windows).Data[uVar16 - 2];
      if (((pIVar23->Active == true) && (pIVar23->Hidden == false)) &&
         (uVar10 = pIVar23->Flags, (uVar10 >> 9 & 1) == 0)) {
        if (pIVar23->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x1256,"void FindHoveredWindow()");
        }
        if (pIVar23->Viewport == pIVar7->MouseViewport) {
          fVar28 = IVar4.x;
          if ((uVar10 & 0x1000042) == 0) {
            fVar28 = (float)lVar14;
          }
          fVar2 = (pIVar7->IO).MousePos.x;
          if ((pIVar23->OuterRectClipped).Min.x - fVar28 <= fVar2) {
            fVar13 = IVar4.y;
            if ((uVar10 & 0x1000042) == 0) {
              fVar13 = (float)((ulong)lVar14 >> 0x20);
            }
            fVar3 = (pIVar7->IO).MousePos.y;
            if (((((pIVar23->OuterRectClipped).Min.y - fVar13 <= fVar3) &&
                 (fVar2 < fVar28 + (pIVar23->OuterRectClipped).Max.x)) &&
                (fVar3 < fVar13 + (pIVar23->OuterRectClipped).Max.y)) &&
               (((sVar6 = (pIVar23->HitTestHoleSize).x, sVar6 == 0 ||
                 (fVar28 = (float)(int)(pIVar23->HitTestHoleOffset).x + (pIVar23->Pos).x,
                 fVar2 < fVar28)) ||
                ((fVar28 + (float)(int)sVar6 <= fVar2 ||
                 ((fVar28 = (float)(int)(pIVar23->HitTestHoleOffset).y + (pIVar23->Pos).y,
                  fVar3 < fVar28 || (fVar28 + (float)(int)(pIVar23->HitTestHoleSize).y <= fVar3)))))
                ))) {
              if (pIVar24 == (ImGuiWindow *)0x0) {
                pIVar24 = pIVar23;
              }
              pIVar25 = pIVar23;
              if (pIVar22 != (ImGuiWindow *)0x0) {
                pIVar25 = pIVar22;
              }
              if (((pIVar8 == (ImGuiWindow *)0x0) || (pIVar22 != (ImGuiWindow *)0x0)) ||
                 (pIVar25 = pIVar23, pIVar23->RootWindow != pIVar8->RootWindow)) {
                pIVar22 = pIVar25;
                if (pIVar24 != (ImGuiWindow *)0x0) {
                  pIVar7->HoveredWindow = pIVar24;
                  goto LAB_001243b5;
                }
                pIVar24 = (ImGuiWindow *)0x0;
              }
              else {
                pIVar22 = (ImGuiWindow *)0x0;
              }
            }
          }
        }
      }
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  pIVar7->HoveredWindow = pIVar24;
  if (pIVar24 == (ImGuiWindow *)0x0) {
    pIVar24 = (ImGuiWindow *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
LAB_001243b5:
    pIVar23 = pIVar24->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar23;
  pIVar7->HoveredWindowUnderMovingWindow = pIVar22;
  if (pIVar8 != (ImGuiWindow *)0x0) {
    pIVar8->Viewport = pIVar11;
  }
  if ((pIVar24 != pIVar8 && pIVar24 != (ImGuiWindow *)0x0) &&
     (pIVar24->Viewport != pIVar7->MouseViewport)) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf16,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  pIVar8 = GetTopMostPopupModal();
  bVar26 = false;
  if ((pIVar8 != (ImGuiWindow *)0x0) && (bVar26 = false, pIVar23 != (ImGuiWindow *)0x0)) {
    if (pIVar23->RootWindow == pIVar8) {
      bVar26 = false;
    }
    else {
      do {
        bVar26 = pIVar23 != pIVar8;
        if (pIVar23 == pIVar8) break;
        pIVar23 = pIVar23->ParentWindow;
      } while (pIVar23 != (ImGuiWindow *)0x0);
    }
  }
  uVar10 = (pIVar7->IO).ConfigFlags;
  iVar18 = -1;
  lVar14 = 0;
  bVar12 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar14] == true) {
      bVar19 = true;
      if (pIVar24 == (ImGuiWindow *)0x0) {
        bVar19 = 0 < (pIVar7->OpenPopupStack).Size;
      }
      (pIVar7->IO).MouseDownOwned[lVar14] = bVar19;
    }
    bVar19 = (pIVar7->IO).MouseDown[lVar14];
    if ((bVar19 == true) &&
       ((iVar18 == -1 ||
        (dVar5 = (pIVar7->IO).MouseClickedTime[iVar18],
        pdVar1 = (pIVar7->IO).MouseClickedTime + lVar14, *pdVar1 <= dVar5 && dVar5 != *pdVar1)))) {
      iVar18 = (int)lVar14;
    }
    bVar12 = bVar12 & 1 | bVar19;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  bVar21 = 1;
  bVar17 = 1;
  if (iVar18 != -1) {
    bVar17 = (pIVar7->IO).MouseDownOwned[iVar18];
  }
  bVar20 = (byte)((uVar10 & 0x10) >> 4) | bVar26;
  if (pIVar7->DragDropActive == true) {
    bVar21 = (pIVar7->DragDropSourceFlags & 0x10U) == 0 | bVar20;
  }
  if (bVar17 != 0) {
    bVar21 = bVar20;
  }
  if (bVar21 != 0) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar24 = (ImGuiWindow *)0x0;
  }
  if (pIVar7->WantCaptureMouseNextFrame == -1) {
    bVar26 = true;
    if ((bVar17 & (pIVar24 != (ImGuiWindow *)0x0 || bVar12 != 0)) == 0) {
      bVar26 = 0 < (pIVar7->OpenPopupStack).Size;
    }
    (pIVar7->IO).WantCaptureMouse = bVar26;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
    bVar26 = pIVar7->ActiveId != 0 || pIVar8 != (ImGuiWindow *)0x0;
  }
  else {
    bVar26 = pIVar7->WantCaptureKeyboardNextFrame != 0;
  }
  uVar10 = uVar10 & 9;
  uVar9 = (char)uVar10;
  if (uVar10 != 1) {
    uVar9 = bVar26;
  }
  if ((pIVar7->IO).NavActive == false) {
    uVar9 = bVar26;
  }
  (pIVar7->IO).WantCaptureKeyboard = (bool)uVar9;
  (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}